

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SlidingWindowsLayerParams::SerializeWithCachedSizes
          (SlidingWindowsLayerParams *this,CodedOutputStream *output)

{
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->axis_,output);
  }
  if (this->windowsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->windowsize_,output);
  }
  if (this->step_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(3,this->step_,output);
    return;
  }
  return;
}

Assistant:

void SlidingWindowsLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SlidingWindowsLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // uint64 windowSize = 2;
  if (this->windowsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->windowsize(), output);
  }

  // uint64 step = 3;
  if (this->step() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(3, this->step(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SlidingWindowsLayerParams)
}